

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O1

gboolean g_hash_table_remove(GHashTable *hash_table,gconstpointer key)

{
  guint gVar1;
  gboolean gVar2;
  GHashNode *pGVar3;
  gboolean gVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  if (hash_table == (GHashTable *)0x0) {
    gVar4 = 0;
  }
  else {
    gVar1 = (*hash_table->hash_func)(key);
    uVar5 = 2;
    if (2 < gVar1) {
      uVar5 = (ulong)gVar1;
    }
    gVar4 = 0;
    uVar7 = uVar5 % (ulong)(uint)hash_table->mod;
    gVar1 = hash_table->nodes[uVar7].key_hash;
    if (gVar1 != 0) {
      pGVar3 = hash_table->nodes + uVar7;
      iVar6 = 1;
      do {
        if (gVar1 == (guint)uVar5) {
          if (hash_table->key_equal_func == (GEqualFunc)0x0) {
            if (pGVar3->key == key) break;
          }
          else {
            gVar2 = (*hash_table->key_equal_func)(pGVar3->key,key);
            if (gVar2 != 0) break;
          }
        }
        uVar7 = (ulong)((int)uVar7 + iVar6 & hash_table->mask);
        pGVar3 = hash_table->nodes + uVar7;
        gVar1 = pGVar3->key_hash;
        iVar6 = iVar6 + 1;
      } while (gVar1 != 0);
    }
    if (hash_table->nodes[uVar7].key_hash != 0) {
      pGVar3 = hash_table->nodes + uVar7;
      if (hash_table->key_destroy_func != (GDestroyNotify)0x0) {
        (*hash_table->key_destroy_func)(pGVar3->key);
      }
      if (hash_table->value_destroy_func != (GDestroyNotify)0x0) {
        (*hash_table->value_destroy_func)(pGVar3->value);
      }
      pGVar3->key_hash = 1;
      pGVar3->key = (gpointer)0x0;
      pGVar3->value = (gpointer)0x0;
      hash_table->nnodes = hash_table->nnodes + -1;
      g_hash_table_maybe_resize(hash_table);
      gVar4 = 1;
    }
  }
  return gVar4;
}

Assistant:

static gboolean g_hash_table_remove_internal (GHashTable *hash_table,
        gconstpointer  key,
        gboolean       notify)
{
    GHashNode *node;
    guint node_index;

    if (hash_table == NULL) return FALSE;

    node_index = g_hash_table_lookup_node (hash_table, key);
    node = &hash_table->nodes [node_index];

    /* g_hash_table_lookup_node() never returns a tombstone, so this is safe */
    if (!node->key_hash)
        return FALSE;

    g_hash_table_remove_node (hash_table, node, notify);
    g_hash_table_maybe_resize (hash_table);

    return TRUE;
}